

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap_disk_io.cpp
# Opt level: O1

storage_holder __thiscall
libtorrent::mmap_disk_io::new_torrent
          (mmap_disk_io *this,storage_params *params,shared_ptr<void> *owner)

{
  storage_index_t sVar1;
  undefined8 *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  storage_holder sVar3;
  shared_ptr<libtorrent::aux::mmap_storage> storage;
  undefined1 local_49;
  shared_ptr<libtorrent::aux::mmap_storage> local_48;
  element_type *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_30;
  
  ::std::__shared_ptr<libtorrent::aux::mmap_storage,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<libtorrent::aux::mmap_storage>,libtorrent::storage_params_const&,libtorrent::aux::file_pool_impl<libtorrent::aux::file_view_entry>&>
            ((__shared_ptr<libtorrent::aux::mmap_storage,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<libtorrent::aux::mmap_storage> *)&local_49,(storage_params *)owner,
             (file_pool_impl<libtorrent::aux::file_view_entry> *)&params[2].priorities);
  (local_38->m_torrent).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)*in_RCX;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(local_38->m_torrent).super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(in_RCX + 1));
  local_48.super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_38;
  local_48.super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = p_Stack_30;
  local_38 = (element_type *)0x0;
  p_Stack_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  sVar1 = aux::storage_array<libtorrent::aux::mmap_storage>::add
                    ((storage_array<libtorrent::aux::mmap_storage> *)&params[0xb].info_hash,
                     &local_48);
  uVar2 = extraout_RDX;
  if (local_48.super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<libtorrent::aux::mmap_storage,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    uVar2 = extraout_RDX_00;
  }
  (this->super_disk_interface)._vptr_disk_interface = (_func_int **)params;
  *(uint *)&this->m_abort = sVar1.m_val;
  if (p_Stack_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_30);
    uVar2 = extraout_RDX_01;
  }
  sVar3._8_8_ = uVar2;
  sVar3.m_disk_io = &this->super_disk_interface;
  return sVar3;
}

Assistant:

storage_holder mmap_disk_io::new_torrent(storage_params const& params
		, std::shared_ptr<void> const& owner)
	{
		TORRENT_ASSERT(params.files.is_valid());

		auto storage = std::make_shared<aux::mmap_storage>(params, m_file_pool);
		storage->set_owner(owner);
		storage_index_t const idx = m_torrents.add(std::move(storage));
		return storage_holder(idx, *this);
	}